

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAV.h
# Opt level: O0

void __thiscall QAV<MonahanPOMDPPlanner>::GetQ(QAV<MonahanPOMDPPlanner> *this)

{
  Index in_stack_00000028;
  Index in_stack_0000002c;
  QAV<MonahanPOMDPPlanner> *in_stack_00000030;
  
  GetQ(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  return;
}

Assistant:

double GetQ(Index jaohI, Index jaI) const
        {
            Index t = GetPU()->GetTimeStepForJAOHI(jaohI);
            //Index t = GetPU()->GetJointActionObservationHistoryTree(jaohI)->
            //GetJointActionObservationHistory()->GetLength();
            JointBeliefInterface * jb = GetPU()->GetJointBeliefInterface(jaohI);
            double q = _m_p->GetQ (*jb, t, jaI);
            delete jb;
            return( q );
        }